

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineTemplate.h
# Opt level: O1

void __thiscall
kiste::LineTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp>::escape
          (LineTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp> *this,
          string *expression)

{
  if (this->data->_report_exceptions == true) {
    std::__ostream_insert<char,std::char_traits<char>>(this->_serialize->_os," try { ",7);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (this->_serialize->_os,"_serialize.escape(",0x12);
  std::__ostream_insert<char,std::char_traits<char>>
            (this->_serialize->_os,(expression->_M_dataplus)._M_p,expression->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(this->_serialize->_os,");",2);
  close_exception_handling(this,expression);
  return;
}

Assistant:

void escape(const std::string& expression)
    {
      static_assert(std::is_same<decltype(open_exception_handling()), void>::value,
                    "$call{} requires void expression");
      (open_exception_handling());
      _serialize.text("_serialize.escape(");
      _serialize.raw(expression);
      _serialize.text(");");
      static_assert(std::is_same<decltype(close_exception_handling(expression)), void>::value,
                    "$call{} requires void expression");
      (close_exception_handling(expression));
    }